

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  int local_f8;
  Option opt_g;
  Mat bottom_blob_tm;
  
  iVar9 = bottom_blob->w;
  iVar12 = bottom_blob->h;
  uVar1 = bottom_blob->c;
  sVar2 = bottom_blob->elemsize;
  Mat::Mat(&bottom_blob_tm,bottom_blob);
  if (sVar2 != 1) {
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    opt_g.use_shader_pack8 = opt->use_shader_pack8;
    opt_g.use_bf16_storage = opt->use_bf16_storage;
    opt_g._36_4_ = *(undefined4 *)&opt->field_0x24;
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator = opt->workspace_allocator;
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    opt_g.use_fp16_packed = opt->use_fp16_packed;
    opt_g.use_fp16_storage = opt->use_fp16_storage;
    opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_g.use_int8_storage = opt->use_int8_storage;
    opt_g.blob_allocator = opt->workspace_allocator;
    quantize_float32_to_int8(bottom_blob,&bottom_blob_tm,this->bottom_blob_int8_scale,&opt_g);
  }
  Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
  local_f8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar11 = iVar12 * iVar9;
    local_f8 = 0;
    uVar15 = 0;
    if (0 < (int)uVar11) {
      uVar15 = (ulong)uVar11;
    }
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    iVar9 = 0;
    for (lVar14 = 0; lVar14 < this->num_output; lVar14 = lVar14 + 1) {
      lVar8 = (long)iVar9;
      pvVar3 = top_blob->data;
      iVar12 = 0;
      for (uVar13 = 0; sVar6 = bottom_blob_tm.cstep, sVar2 = bottom_blob_tm.elemsize,
          pvVar5 = bottom_blob_tm.data, uVar13 != uVar10; uVar13 = uVar13 + 1) {
        pvVar4 = (this->weight_data).data;
        opt_g._0_8_ = bottom_blob_tm.cstep * uVar13 * bottom_blob_tm.elemsize +
                      (long)bottom_blob_tm.data;
        opt_g.blob_allocator = (Allocator *)0x0;
        opt_g.workspace_allocator = (Allocator *)bottom_blob_tm.elemsize;
        opt_g.use_winograd_convolution = (bool)(undefined1)bottom_blob_tm.elempack;
        opt_g.use_sgemm_convolution = (bool)bottom_blob_tm.elempack._1_1_;
        opt_g.use_int8_inference = (bool)bottom_blob_tm.elempack._2_1_;
        opt_g.use_vulkan_compute = (bool)bottom_blob_tm.elempack._3_1_;
        opt_g._32_8_ = bottom_blob_tm.allocator;
        Mat::~Mat((Mat *)&opt_g);
        for (uVar7 = 0; uVar15 != uVar7; uVar7 = uVar7 + 1) {
          iVar12 = iVar12 + (int)*(char *)((long)pvVar4 + uVar7 + lVar8) *
                            (int)*(char *)((long)pvVar5 + uVar7 + sVar6 * sVar2 * uVar13);
        }
        lVar8 = lVar8 + (int)uVar11;
      }
      fVar16 = *(float *)((long)(this->weight_data_int8_scales).data + lVar14 * 4);
      fVar16 = (float)iVar12 *
               (float)(~-(uint)(fVar16 == 0.0) &
                      (uint)(1.0 / (this->bottom_blob_int8_scale * fVar16)));
      if (this->bias_term != 0) {
        fVar16 = fVar16 + *(float *)((long)(this->bias_data).data + lVar14 * 4);
      }
      fVar17 = 0.0;
      if (0.0 <= fVar16) {
        fVar17 = fVar16;
      }
      if (this->activation_type != 1) {
        fVar17 = fVar16;
      }
      *(float *)((long)pvVar3 + lVar14 * 4) = fVar17;
      iVar9 = iVar9 + uVar1 * uVar11;
    }
  }
  Mat::~Mat(&bottom_blob_tm);
  return local_f8;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_tm = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_tm, bottom_blob_int8_scale, opt_g);
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        // channels
        for (int q=0; q<channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
            const signed char* m = bottom_blob_tm.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        if (activation_type == 1)
        {
            sumfp32 = std::max(sumfp32, 0.f);
        }

        outptr[p] = sumfp32;
    }

    return 0;
}